

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O2

void __thiscall cmQtAutoGeneratorRcc::PollStage(cmQtAutoGeneratorRcc *this)

{
  bool bVar1;
  StageT SStack_10;
  
  switch(this->Stage_) {
  case SETTINGS_READ:
    bVar1 = SettingsFileRead(this);
    if (bVar1) {
      SStack_10 = TEST_QRC_RCC_FILES;
      break;
    }
    goto LAB_00187cb1;
  case TEST_QRC_RCC_FILES:
    bVar1 = TestQrcRccFiles(this);
    if (!bVar1) {
      SStack_10 = TEST_RESOURCES_READ;
      break;
    }
    goto LAB_00187c87;
  case TEST_RESOURCES_READ:
    bVar1 = TestResourcesRead(this);
    if (!bVar1) {
      return;
    }
    SStack_10 = TEST_RESOURCES;
    break;
  case TEST_RESOURCES:
    bVar1 = TestResources(this);
    if (!bVar1) {
      SStack_10 = TEST_INFO_FILE;
      break;
    }
LAB_00187c87:
    SStack_10 = GENERATE;
    break;
  case TEST_INFO_FILE:
    TestInfoFile(this);
    goto LAB_00187ca3;
  case GENERATE:
    GenerateParentDir(this);
    SStack_10 = GENERATE_RCC;
    break;
  case GENERATE_RCC:
    bVar1 = GenerateRcc(this);
    if (!bVar1) {
      return;
    }
LAB_00187ca3:
    SStack_10 = GENERATE_WRAPPER;
    break;
  case GENERATE_WRAPPER:
    GenerateWrapper(this);
    SStack_10 = SETTINGS_WRITE;
    break;
  case SETTINGS_WRITE:
    SettingsFileWrite(this);
LAB_00187cb1:
    SStack_10 = FINISH;
    break;
  case FINISH:
    ::cm::uv_handle_ptr_base_<uv_async_s>::reset
              ((uv_handle_ptr_base_<uv_async_s> *)&(this->super_cmQtAutoGenerator).UVRequest_);
    this->Stage_ = END;
  default:
    return;
  }
  SetStage(this,SStack_10);
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::PollStage()
{
  switch (Stage_) {
    // -- Initialize
    case StageT::SETTINGS_READ:
      if (SettingsFileRead()) {
        SetStage(StageT::TEST_QRC_RCC_FILES);
      } else {
        SetStage(StageT::FINISH);
      }
      break;

    // -- Change detection
    case StageT::TEST_QRC_RCC_FILES:
      if (TestQrcRccFiles()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_RESOURCES_READ);
      }
      break;
    case StageT::TEST_RESOURCES_READ:
      if (TestResourcesRead()) {
        SetStage(StageT::TEST_RESOURCES);
      }
      break;
    case StageT::TEST_RESOURCES:
      if (TestResources()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_INFO_FILE);
      }
      break;
    case StageT::TEST_INFO_FILE:
      TestInfoFile();
      SetStage(StageT::GENERATE_WRAPPER);
      break;

    // -- Generation
    case StageT::GENERATE:
      GenerateParentDir();
      SetStage(StageT::GENERATE_RCC);
      break;
    case StageT::GENERATE_RCC:
      if (GenerateRcc()) {
        SetStage(StageT::GENERATE_WRAPPER);
      }
      break;
    case StageT::GENERATE_WRAPPER:
      GenerateWrapper();
      SetStage(StageT::SETTINGS_WRITE);
      break;

    // -- Finalize
    case StageT::SETTINGS_WRITE:
      SettingsFileWrite();
      SetStage(StageT::FINISH);
      break;
    case StageT::FINISH:
      // Clear all libuv handles
      UVRequest().reset();
      // Set highest END stage manually
      Stage_ = StageT::END;
      break;
    case StageT::END:
      break;
  }
}